

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O2

Error __thiscall
asmjit::CodeHolder::newRelocEntry(CodeHolder *this,RelocEntry **dst,uint32_t relocType)

{
  size_type sVar1;
  Error EVar2;
  bool bVar3;
  RelocEntry *re;
  
  EVar2 = ZoneVector<asmjit::RelocEntry_*>::willGrow(&this->_relocations,&this->_allocator,1);
  if (EVar2 == 0) {
    sVar1 = (this->_relocations).super_ZoneVectorBase._size;
    if (sVar1 == 0xffffffff) {
      EVar2 = 0x17;
    }
    else {
      re = (RelocEntry *)ZoneAllocator::allocZeroed(&this->_allocator,0x28);
      bVar3 = re != (RelocEntry *)0x0;
      if (bVar3) {
        re->_id = sVar1;
        re->_relocType = relocType & 0xff;
        re->_sourceSectionId = 0xffffffff;
        re->_targetSectionId = 0xffffffff;
        ZoneVector<asmjit::RelocEntry_*>::appendUnsafe(&this->_relocations,&re);
        *dst = re;
      }
      EVar2 = (Error)!bVar3;
    }
  }
  return EVar2;
}

Assistant:

Error CodeHolder::newRelocEntry(RelocEntry** dst, uint32_t relocType) noexcept {
  ASMJIT_PROPAGATE(_relocations.willGrow(&_allocator));

  uint32_t relocId = _relocations.size();
  if (ASMJIT_UNLIKELY(relocId == Globals::kInvalidId))
    return DebugUtils::errored(kErrorTooManyRelocations);

  RelocEntry* re = _allocator.allocZeroedT<RelocEntry>();
  if (ASMJIT_UNLIKELY(!re))
    return DebugUtils::errored(kErrorOutOfMemory);

  re->_id = relocId;
  re->_relocType = uint8_t(relocType);
  re->_sourceSectionId = Globals::kInvalidId;
  re->_targetSectionId = Globals::kInvalidId;
  _relocations.appendUnsafe(re);

  *dst = re;
  return kErrorOk;
}